

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode
JsAllocRawData(JsRuntimeHandle runtimeHandle,size_t sizeInBytes,bool zeroed,JsRef *buffer)

{
  ThreadContext *threadContext;
  JsrtRuntime *pJVar1;
  Recycler *pRVar2;
  char *pcVar3;
  JsErrorCode JVar4;
  undefined1 local_a0 [8];
  TrackAllocData data;
  TrackAllocData data_1;
  undefined1 local_48 [8];
  ThreadContextScope scope;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (buffer == (JsRef *)0x0) {
    JVar4 = JsErrorNullArgument;
  }
  else {
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&scope.originalContext + 4),
               ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (runtimeHandle == (JsRuntimeHandle)0x0) {
      JVar4 = JsErrorInvalidArgument;
    }
    else {
      pJVar1 = JsrtRuntime::FromHandle(runtimeHandle);
      threadContext = pJVar1->threadContext;
      ThreadContextScope::ThreadContextScope((ThreadContextScope *)local_48,threadContext);
      JVar4 = JsErrorWrongThread;
      if (local_48[1] == true) {
        pRVar2 = threadContext->recycler;
        if (zeroed) {
          data._32_8_ = &char::typeinfo;
          pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)&data.line);
          pcVar3 = Memory::AllocateArray<Memory::Recycler,char,false>
                             ((Memory *)pRVar2,(Recycler *)Memory::Recycler::AllocZero,0,sizeInBytes
                             );
        }
        else {
          local_a0 = (undefined1  [8])&char::typeinfo;
          data.typeinfo = (type_info *)0x0;
          data.count = (size_t)anon_var_dwarf_695a4b;
          data.filename._0_4_ = 0x5b1;
          data.plusSize = sizeInBytes;
          pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_a0);
          pcVar3 = Memory::AllocateArray<Memory::Recycler,char,false>
                             ((Memory *)pRVar2,(Recycler *)Memory::Recycler::Alloc,0,sizeInBytes);
        }
        *buffer = pcVar3;
        JVar4 = JsNoError;
      }
      ThreadContextScope::~ThreadContextScope((ThreadContextScope *)local_48);
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&scope.originalContext + 4));
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsAllocRawData(_In_ JsRuntimeHandle runtimeHandle, _In_ size_t sizeInBytes, _In_ bool zeroed, _Out_ JsRef * buffer)
{
    PARAM_NOT_NULL(buffer);

    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
        ThreadContextScope scope(threadContext);

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        Recycler * recycler = threadContext->GetRecycler();
        *buffer = zeroed
            ? RecyclerNewArrayZ(recycler, char, sizeInBytes)
            : RecyclerNewArray(recycler, char, sizeInBytes);
        return JsNoError;
    });
}